

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O3

void __thiscall
btMultiBodyPoint2Point::btMultiBodyPoint2Point
          (btMultiBodyPoint2Point *this,btMultiBody *body,int link,btRigidBody *bodyB,
          btVector3 *pivotInA,btVector3 *pivotInB)

{
  float *ptr;
  undefined8 uVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  btMultiBodyConstraint::btMultiBodyConstraint
            (&this->super_btMultiBodyConstraint,body,(btMultiBody *)0x0,link,-1,3,false);
  (this->super_btMultiBodyConstraint)._vptr_btMultiBodyConstraint =
       (_func_int **)&PTR__btMultiBodyPoint2Point_00221198;
  this->m_rigidBodyA = (btRigidBody *)0x0;
  this->m_rigidBodyB = bodyB;
  uVar1 = *(undefined8 *)(pivotInA->m_floats + 2);
  *(undefined8 *)(this->m_pivotInA).m_floats = *(undefined8 *)pivotInA->m_floats;
  *(undefined8 *)((this->m_pivotInA).m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)(pivotInB->m_floats + 2);
  *(undefined8 *)(this->m_pivotInB).m_floats = *(undefined8 *)pivotInB->m_floats;
  *(undefined8 *)((this->m_pivotInB).m_floats + 2) = uVar1;
  lVar5 = (long)(this->super_btMultiBodyConstraint).m_data.m_size;
  if (2 < lVar5) goto LAB_001c90ef;
  if ((this->super_btMultiBodyConstraint).m_data.m_capacity < 3) {
    pfVar2 = (float *)btAlignedAllocInternal(0xc,0x10);
    lVar3 = (long)(this->super_btMultiBodyConstraint).m_data.m_size;
    ptr = (this->super_btMultiBodyConstraint).m_data.m_data;
    if (lVar3 < 1) {
      if (ptr != (float *)0x0) goto LAB_001c90be;
    }
    else {
      lVar4 = 0;
      do {
        pfVar2[lVar4] = ptr[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
LAB_001c90be:
      if ((this->super_btMultiBodyConstraint).m_data.m_ownsMemory == true) {
        btAlignedFreeInternal(ptr);
      }
    }
    (this->super_btMultiBodyConstraint).m_data.m_ownsMemory = true;
    (this->super_btMultiBodyConstraint).m_data.m_data = pfVar2;
    (this->super_btMultiBodyConstraint).m_data.m_capacity = 3;
  }
  else {
    pfVar2 = (this->super_btMultiBodyConstraint).m_data.m_data;
  }
  memset(pfVar2 + lVar5,0,lVar5 * -4 + 0xc);
LAB_001c90ef:
  (this->super_btMultiBodyConstraint).m_data.m_size = 3;
  return;
}

Assistant:

btMultiBodyPoint2Point::btMultiBodyPoint2Point(btMultiBody* body, int link, btRigidBody* bodyB, const btVector3& pivotInA, const btVector3& pivotInB)
	:btMultiBodyConstraint(body,0,link,-1,BTMBP2PCONSTRAINT_DIM,false),
	m_rigidBodyA(0),
	m_rigidBodyB(bodyB),
	m_pivotInA(pivotInA),
	m_pivotInB(pivotInB)
{
    m_data.resize(BTMBP2PCONSTRAINT_DIM);//at least store the applied impulses
}